

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMan.c
# Opt level: O1

Cut_Man_t * Cut_ManStart(Cut_Params_t *pParams)

{
  int iVar1;
  uint uVar2;
  Cut_Man_t *__s;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  ulong uVar5;
  uint *puVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int *piVar9;
  Extra_MmFixed_t *pEVar10;
  int iVar11;
  size_t sVar12;
  uint uVar13;
  long lVar14;
  
  iVar1 = pParams->nVarsMax;
  if (iVar1 - 3U < 10) {
    __s = (Cut_Man_t *)malloc(0x140);
    ppvVar4 = (void **)0x0;
    memset(__s,0,0x140);
    __s->pParams = pParams;
    uVar2 = pParams->nIdsMax;
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    uVar13 = 8;
    if (6 < uVar2 - 1) {
      uVar13 = uVar2;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = uVar13;
    if (uVar13 != 0) {
      ppvVar4 = (void **)malloc((long)(int)uVar13 * 8);
    }
    pVVar3->pArray = ppvVar4;
    __s->vCutsNew = pVVar3;
    if ((int)uVar13 < (int)uVar2) {
      sVar12 = (long)(int)uVar2 * 8;
      if (ppvVar4 == (void **)0x0) {
        ppvVar4 = (void **)malloc(sVar12);
      }
      else {
        ppvVar4 = (void **)realloc(ppvVar4,sVar12);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        pVVar3->pArray[uVar5] = (void *)0x0;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    pVVar3->nSize = uVar2;
    if (pParams->fSeq != 0) {
      pParams->fFilter = 1;
      pVVar3 = (Vec_Ptr_t *)malloc(0x10);
      pVVar3->nSize = 0;
      pVVar3->nCap = uVar13;
      if (uVar13 == 0) {
        ppvVar4 = (void **)0x0;
      }
      else {
        ppvVar4 = (void **)malloc((long)(int)uVar13 << 3);
      }
      pVVar3->pArray = ppvVar4;
      __s->vCutsOld = pVVar3;
      if ((int)uVar13 < (int)uVar2) {
        sVar12 = (long)(int)uVar2 << 3;
        if (ppvVar4 == (void **)0x0) {
          ppvVar4 = (void **)malloc(sVar12);
        }
        else {
          ppvVar4 = (void **)realloc(ppvVar4,sVar12);
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = uVar2;
      }
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          pVVar3->pArray[uVar5] = (void *)0x0;
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      pVVar3->nSize = uVar2;
      uVar2 = pParams->nCutSet;
      pVVar3 = (Vec_Ptr_t *)malloc(0x10);
      uVar13 = 8;
      if (6 < uVar2 - 1) {
        uVar13 = uVar2;
      }
      pVVar3->nSize = 0;
      pVVar3->nCap = uVar13;
      if (uVar13 == 0) {
        ppvVar4 = (void **)0x0;
      }
      else {
        ppvVar4 = (void **)malloc((long)(int)uVar13 << 3);
      }
      pVVar3->pArray = ppvVar4;
      __s->vCutsTemp = pVVar3;
      if ((int)uVar13 < (int)uVar2) {
        if (ppvVar4 == (void **)0x0) {
          ppvVar4 = (void **)malloc((long)(int)uVar2 << 3);
        }
        else {
          ppvVar4 = (void **)realloc(ppvVar4,(long)(int)uVar2 << 3);
        }
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = uVar2;
      }
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          pVVar3->pArray[uVar5] = (void *)0x0;
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      pVVar3->nSize = uVar2;
      if ((5 < iVar1) && (pParams->fTruth != 0)) {
        pParams->fTruth = 0;
        puts("Skipping computation of truth tables for sequential cuts with more than 5 inputs.");
      }
    }
    iVar1 = pParams->nVarsMax;
    __s->EntrySize = iVar1 * 4 + 0x18;
    if (pParams->fTruth != 0) {
      if (iVar1 < 0xf) {
        iVar11 = 1 << ((char)iVar1 - 5U & 0x1f);
        if (iVar1 < 6) {
          iVar11 = 1;
        }
        __s->nTruthWords = iVar11;
        __s->EntrySize = (iVar11 + iVar1) * 4 + 0x18;
      }
      else {
        pParams->fTruth = 0;
        printf("Skipping computation of truth table for more than %d inputs.\n");
      }
      lVar14 = (long)__s->nTruthWords;
      puVar6 = (uint *)malloc(lVar14 << 4);
      __s->puTemp[0] = puVar6;
      puVar6 = puVar6 + lVar14;
      __s->puTemp[1] = puVar6;
      __s->puTemp[2] = puVar6 + lVar14;
      __s->puTemp[3] = puVar6 + lVar14 + lVar14;
    }
    if (pParams->fRecord != 0) {
      iVar1 = pParams->nIdsMax;
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      iVar11 = 0x10;
      if (0xe < iVar1 - 1U) {
        iVar11 = iVar1;
      }
      pVVar7->nSize = 0;
      pVVar7->nCap = iVar11;
      if (iVar11 == 0) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)malloc((long)iVar11 * 4);
      }
      pVVar7->pArray = piVar8;
      pVVar7->nSize = iVar1;
      piVar9 = (int *)0x0;
      memset(piVar8,0,(long)iVar1 << 2);
      __s->vNodeCuts = pVVar7;
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      pVVar7->nSize = 0;
      pVVar7->nCap = iVar11;
      if (iVar11 != 0) {
        piVar9 = (int *)malloc((long)iVar11 << 2);
      }
      pVVar7->pArray = piVar9;
      pVVar7->nSize = iVar1;
      memset(piVar9,0,(long)iVar1 << 2);
      __s->vNodeStarts = pVVar7;
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      pVVar7->nCap = 0;
      pVVar7->nSize = 0;
      pVVar7->pArray = (int *)0x0;
      __s->vCutPairs = pVVar7;
    }
    if ((pParams->fMap != 0) && (__s->pParams->fSeq == 0)) {
      iVar1 = pParams->nIdsMax;
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      iVar11 = 0x10;
      if (0xe < iVar1 - 1U) {
        iVar11 = iVar1;
      }
      pVVar7->nSize = 0;
      pVVar7->nCap = iVar11;
      if (iVar11 == 0) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = (int *)malloc((long)iVar11 * 4);
      }
      pVVar7->pArray = piVar8;
      pVVar7->nSize = iVar1;
      sVar12 = (long)iVar1 * 4;
      piVar9 = (int *)0x0;
      memset(piVar8,0,sVar12);
      __s->vDelays = pVVar7;
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      pVVar7->nSize = 0;
      pVVar7->nCap = iVar11;
      if (iVar11 != 0) {
        piVar9 = (int *)malloc((long)iVar11 << 2);
      }
      pVVar7->pArray = piVar9;
      pVVar7->nSize = iVar1;
      ppvVar4 = (void **)0x0;
      memset(piVar9,0,sVar12);
      __s->vDelays2 = pVVar7;
      pVVar3 = (Vec_Ptr_t *)malloc(0x10);
      iVar11 = 8;
      if (6 < iVar1 - 1U) {
        iVar11 = iVar1;
      }
      pVVar3->nSize = 0;
      pVVar3->nCap = iVar11;
      if (iVar11 != 0) {
        ppvVar4 = (void **)malloc((long)iVar11 << 3);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nSize = iVar1;
      memset(ppvVar4,0,(long)iVar1 << 3);
      __s->vCutsMax = pVVar3;
    }
    pEVar10 = Extra_MmFixedStart(__s->EntrySize);
    __s->pMmCuts = pEVar10;
    pVVar3 = (Vec_Ptr_t *)malloc(0x10);
    pVVar3->nCap = 100;
    pVVar3->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    pVVar3->pArray = ppvVar4;
    __s->vTemp = pVVar3;
    return __s;
  }
  __assert_fail("pParams->nVarsMax >= 3 && pParams->nVarsMax <= CUT_SIZE_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutMan.c"
                ,0x34,"Cut_Man_t *Cut_ManStart(Cut_Params_t *)");
}

Assistant:

Cut_Man_t * Cut_ManStart( Cut_Params_t * pParams )
{
    Cut_Man_t * p;
//    extern int nTruthDsd;
//    nTruthDsd = 0;
    assert( pParams->nVarsMax >= 3 && pParams->nVarsMax <= CUT_SIZE_MAX );
    p = ABC_ALLOC( Cut_Man_t, 1 );
    memset( p, 0, sizeof(Cut_Man_t) );
    // set and correct parameters
    p->pParams = pParams;
    // prepare storage for cuts
    p->vCutsNew = Vec_PtrAlloc( pParams->nIdsMax );
    Vec_PtrFill( p->vCutsNew, pParams->nIdsMax, NULL );
    // prepare storage for sequential cuts
    if ( pParams->fSeq )
    {
        p->pParams->fFilter = 1;
        p->vCutsOld = Vec_PtrAlloc( pParams->nIdsMax );
        Vec_PtrFill( p->vCutsOld, pParams->nIdsMax, NULL );
        p->vCutsTemp = Vec_PtrAlloc( pParams->nCutSet );
        Vec_PtrFill( p->vCutsTemp, pParams->nCutSet, NULL );
        if ( pParams->fTruth && pParams->nVarsMax > 5 )
        {
            pParams->fTruth = 0;
            printf( "Skipping computation of truth tables for sequential cuts with more than 5 inputs.\n" );
        }
    }
    // entry size
    p->EntrySize = sizeof(Cut_Cut_t) + pParams->nVarsMax * sizeof(int);
    if ( pParams->fTruth )
    {
        if ( pParams->nVarsMax > 14 )
        {
            pParams->fTruth = 0;
            printf( "Skipping computation of truth table for more than %d inputs.\n", 14 );
        }
        else
        {
            p->nTruthWords = Cut_TruthWords( pParams->nVarsMax );
            p->EntrySize += p->nTruthWords * sizeof(unsigned);
        }
        p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
        p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
        p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
        p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    }
    // enable cut computation recording
    if ( pParams->fRecord )
    {
        p->vNodeCuts   = Vec_IntStart( pParams->nIdsMax );
        p->vNodeStarts = Vec_IntStart( pParams->nIdsMax );
        p->vCutPairs   = Vec_IntAlloc( 0 );
    }
    // allocate storage for delays
    if ( pParams->fMap && !p->pParams->fSeq )
    {
        p->vDelays = Vec_IntStart( pParams->nIdsMax );
        p->vDelays2 = Vec_IntStart( pParams->nIdsMax );
        p->vCutsMax = Vec_PtrStart( pParams->nIdsMax );
    }
    // memory for cuts
    p->pMmCuts = Extra_MmFixedStart( p->EntrySize );
    p->vTemp = Vec_PtrAlloc( 100 );
    return p;
}